

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool __thiscall Abs<0,_0>::propagate(Abs<0,_0> *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  IntVar *pIVar5;
  IntVar *pIVar6;
  long lVar7;
  ulong uVar8;
  _func_int **pp_Var9;
  int64_t m_v;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  pIVar6 = (this->x).var;
  iVar3 = (pIVar6->min).v;
  lVar10 = (long)iVar3;
  iVar1 = (pIVar6->max).v;
  uVar12 = (ulong)iVar1;
  if (lVar10 < 0) {
    if (iVar1 < 1) {
      pIVar5 = (this->y).var;
      lVar7 = (long)(pIVar5->min).v;
      if (SBORROW8(lVar7,-uVar12) != (long)(lVar7 + uVar12) < 0) {
        if (so.lazy) {
          iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])();
          lVar7 = (long)iVar3 * 4 + 2;
          pIVar5 = (this->y).var;
        }
        else {
          lVar7 = 0;
        }
        iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xe])(pIVar5,-uVar12,lVar7,1);
        if ((char)iVar3 == '\0') goto LAB_001ac0fc;
        pIVar5 = (this->y).var;
      }
      uVar11 = -lVar10;
      uVar12 = (ulong)(pIVar5->max).v;
      if (uVar12 != uVar11 && SBORROW8(uVar12,uVar11) == (long)(uVar12 + lVar10) < 0) {
        if (so.lazy != true) goto LAB_001ac03e;
        pIVar6 = (this->x).var;
LAB_001ac012:
        iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])();
        uVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
        uVar8 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
        pIVar5 = (this->y).var;
        uVar12 = uVar11;
        goto LAB_001ac040;
      }
    }
    else {
      uVar11 = -lVar10;
      if ((ulong)-lVar10 < uVar12) {
        uVar11 = uVar12;
      }
      pIVar5 = (this->y).var;
      if ((long)uVar11 < (long)(pIVar5->max).v) {
        if (so.lazy) goto LAB_001ac012;
LAB_001ac03e:
        uVar8 = 0;
        uVar12 = uVar11;
LAB_001ac040:
        pp_Var9 = (pIVar5->super_Var).super_Branching._vptr_Branching;
        goto LAB_001ac049;
      }
    }
LAB_001ac05a:
    pIVar5 = (this->x).var;
    pIVar6 = (this->y).var;
    iVar3 = (pIVar6->max).v;
    lVar10 = (long)iVar3;
    if (iVar3 < (pIVar5->max).v) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])(pIVar6);
        lVar7 = (long)iVar3 * 4 + 2;
        pIVar5 = (this->x).var;
      }
      else {
        lVar7 = 0;
      }
      iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xf])(pIVar5,lVar10,lVar7,1);
      if ((char)iVar3 == '\0') goto LAB_001ac0fc;
      pIVar5 = (this->x).var;
      pIVar6 = (this->y).var;
      lVar10 = (long)(pIVar6->max).v;
    }
    lVar7 = (long)(pIVar5->min).v;
    if (SBORROW8(lVar7,-lVar10) != lVar7 + lVar10 < 0) {
      if (so.lazy == true) {
        iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])(pIVar6);
        lVar7 = (long)iVar3 * 4 + 2;
        pIVar5 = (this->x).var;
      }
      else {
        lVar7 = 0;
      }
      iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xe])(pIVar5,-lVar10,lVar7,1);
      if ((char)iVar3 == '\0') goto LAB_001ac0fc;
    }
    bVar2 = true;
  }
  else {
    pIVar5 = (this->y).var;
    if (iVar3 <= (pIVar5->min).v) {
LAB_001abf4e:
      if (iVar1 < (pIVar5->max).v) {
        if (so.lazy == true) {
          iVar3 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
          uVar4 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
          uVar8 = (ulong)uVar4 << 0x20 | (long)iVar3 << 2 | 3;
          pIVar5 = (this->y).var;
        }
        else {
          uVar8 = 0;
        }
        pp_Var9 = (pIVar5->super_Var).super_Branching._vptr_Branching;
LAB_001ac049:
        iVar3 = (*pp_Var9[0xf])(pIVar5,uVar12,uVar8,1);
        if ((char)iVar3 == '\0') goto LAB_001ac0fc;
      }
      goto LAB_001ac05a;
    }
    if (so.lazy) {
      iVar3 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[8])();
      lVar7 = (long)iVar3 * 4 + 2;
      pIVar5 = (this->y).var;
    }
    else {
      lVar7 = 0;
    }
    iVar3 = (*(pIVar5->super_Var).super_Branching._vptr_Branching[0xe])(pIVar5,lVar10,lVar7,1);
    if ((char)iVar3 != '\0') {
      pIVar5 = (this->y).var;
      goto LAB_001abf4e;
    }
LAB_001ac0fc:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool propagate() override {
		const int64_t l = x.getMin();
		const int64_t u = x.getMax();

		if (l >= 0) {
			setDom(y, setMin, l, x.getMinLit());
			setDom(y, setMax, u, x.getMinLit(), x.getMaxLit());
		} else if (u <= 0) {
			setDom(y, setMin, -u, x.getMaxLit());
			setDom(y, setMax, -l, x.getMaxLit(), x.getMinLit());
		} else {
			// Finesse stronger bound
			const int64_t t = (-l > u ? -l : u);
			setDom(y, setMax, t, x.getMaxLit(), x.getMinLit());
			//			setDom(y, setMax, t, x.getFMaxLit(t), x.getFMinLit(-t));
			//			setDom(y, setMax, t, x.getLit(t+1, LR_GE), x.getLit(-t-1, LR_LE));
		}

		setDom(x, setMax, y.getMax(), y.getMaxLit());
		setDom(x, setMin, -y.getMax(), y.getMaxLit());

		/*
				if (x.isFixed()) {
					if (x.getVal() < 0) {
						setDom(y, setMin, -x.getVal(), x.getMaxLit());
						setDom(y, setMax, -x.getVal(), x.getMinLit());
					} else if (x.getVal() > 0) {
						setDom(y, setMin, x.getVal(), x.getMinLit());
						setDom(y, setMax, x.getVal(), x.getMaxLit());
					} else {
						setDom(y, setVal, 0, x.getMinLit(), x.getMaxLit());
					}
				}
		*/

		return true;
	}